

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ashared_ptr.h
# Opt level: O0

void __thiscall
ashared_ptr<MapWrapper>::releaseObject(ashared_ptr<MapWrapper> *this,PtrWrapper<MapWrapper> *target)

{
  __pointer_type pMVar1;
  atomic<MapWrapper_*> *this_00;
  __pointer_type pMVar2;
  void *in_RSI;
  undefined8 in_stack_ffffffffffffffb0;
  
  if (in_RSI != (void *)0x0) {
    this_00 = (atomic<MapWrapper_*> *)((long)in_RSI + 8);
    LOCK();
    pMVar1 = (this_00->_M_b)._M_p;
    (this_00->_M_b)._M_p =
         (__pointer_type)((long)&(this_00->_M_b)._M_p[-1].map._M_h._M_single_bucket + 7);
    UNLOCK();
    if (pMVar1 == (__pointer_type)0x1) {
      pMVar2 = std::atomic<MapWrapper_*>::load
                         (this_00,(memory_order)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
      if (pMVar2 != (__pointer_type)0x0) {
        MapWrapper::~MapWrapper((MapWrapper *)0x1048f9);
        operator_delete(pMVar2);
      }
      if (in_RSI != (void *)0x0) {
        operator_delete(in_RSI);
      }
    }
  }
  return;
}

Assistant:

void releaseObject(PtrWrapper<T>* target) {
        if (!target) return;
        if (target->refCount.fetch_sub(1, MO) == 1) {
            // Last shared pointer, delete it.
            delete target->ptr.load(MO);
            delete target;
        }
    }